

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

int do_check_string(ASN1_STRING *a,int cmp_type,equal_fn equal,uint flags,int check_type,char *b,
                   size_t blen,char **peername)

{
  uchar *__s1;
  uint uVar1;
  int iVar2;
  uchar *in_RAX;
  char *pcVar3;
  uchar *astr;
  uchar *local_38;
  
  __s1 = a->data;
  if (__s1 == (uchar *)0x0) {
    return 0;
  }
  iVar2 = a->length;
  if ((long)iVar2 == 0) {
    return 0;
  }
  if (0 < cmp_type) {
    if (a->type != cmp_type) {
      return 0;
    }
    if (cmp_type == 0x16) {
      uVar1 = (*equal)(__s1,(long)iVar2,(uchar *)b,blen,flags);
    }
    else {
      if (iVar2 != (int)blen) {
        return 0;
      }
      uVar1 = 1;
      if ((blen != 0) && (iVar2 = bcmp(__s1,b,blen), iVar2 != 0)) {
        return 0;
      }
    }
    if (peername == (char **)0x0 || (int)uVar1 < 1) {
      return uVar1;
    }
    pcVar3 = OPENSSL_strndup((char *)a->data,(long)a->length);
    *peername = pcVar3;
    return -(uint)(pcVar3 == (char *)0x0) | uVar1;
  }
  local_38 = in_RAX;
  uVar1 = ASN1_STRING_to_UTF8(&local_38,(ASN1_STRING *)a);
  if ((int)uVar1 < 0) {
LAB_001aa516:
    iVar2 = -1;
  }
  else {
    if ((check_type == 2) && (iVar2 = x509v3_looks_like_dns_name(local_38,(ulong)uVar1), iVar2 == 0)
       ) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*equal)(local_38,(ulong)uVar1,(uchar *)b,blen,flags);
      if (peername != (char **)0x0 && 0 < iVar2) {
        pcVar3 = OPENSSL_strndup((char *)local_38,(ulong)uVar1);
        *peername = pcVar3;
        if (pcVar3 == (char *)0x0) goto LAB_001aa516;
      }
    }
    OPENSSL_free(local_38);
  }
  return iVar2;
}

Assistant:

static int do_check_string(const ASN1_STRING *a, int cmp_type, equal_fn equal,
                           unsigned int flags, int check_type, const char *b,
                           size_t blen, char **peername) {
  int rv = 0;

  if (!a->data || !a->length) {
    return 0;
  }
  if (cmp_type > 0) {
    if (cmp_type != a->type) {
      return 0;
    }
    if (cmp_type == V_ASN1_IA5STRING) {
      rv = equal(a->data, a->length, (unsigned char *)b, blen, flags);
    } else if (a->length == (int)blen && !OPENSSL_memcmp(a->data, b, blen)) {
      rv = 1;
    }
    if (rv > 0 && peername) {
      *peername = OPENSSL_strndup((char *)a->data, a->length);
      if (*peername == NULL) {
        return -1;
      }
    }
  } else {
    int astrlen;
    unsigned char *astr;
    astrlen = ASN1_STRING_to_UTF8(&astr, a);
    if (astrlen < 0) {
      return -1;
    }
    // We check the common name against DNS name constraints if it passes
    // |x509v3_looks_like_dns_name|. Thus we must not consider common names
    // for DNS fallbacks if they fail this check.
    if (check_type == GEN_DNS && !x509v3_looks_like_dns_name(astr, astrlen)) {
      rv = 0;
    } else {
      rv = equal(astr, astrlen, (unsigned char *)b, blen, flags);
    }
    if (rv > 0 && peername) {
      *peername = OPENSSL_strndup((char *)astr, astrlen);
      if (*peername == NULL) {
        return -1;
      }
    }
    OPENSSL_free(astr);
  }
  return rv;
}